

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

ComputeTestFeatures vkt::SpirVAssembly::getConversionUsedFeatures(IntegerType from,IntegerType to)

{
  if (to != INTEGER_TYPE_SIGNED_16) {
    if ((from == INTEGER_TYPE_SIGNED_16) || (from == INTEGER_TYPE_UNSIGNED_16)) {
      if (to == INTEGER_TYPE_SIGNED_64) {
        return COMPUTE_TEST_USES_INT16_INT64;
      }
    }
    else if (to != INTEGER_TYPE_UNSIGNED_16) {
      return COMPUTE_TEST_USES_INT64;
    }
  }
  if (((from != INTEGER_TYPE_SIGNED_64) && (from != INTEGER_TYPE_UNSIGNED_64)) &&
     (to != INTEGER_TYPE_UNSIGNED_64)) {
    return COMPUTE_TEST_USES_INT16;
  }
  return COMPUTE_TEST_USES_INT16_INT64;
}

Assistant:

ComputeTestFeatures getConversionUsedFeatures (IntegerType from, IntegerType to)
{
	if (usesInt16(from, to))
	{
		if (usesInt64(from, to))
		{
			return COMPUTE_TEST_USES_INT16_INT64;
		}
		else
		{
			return COMPUTE_TEST_USES_INT16;
		}
	}
	else
	{
		return COMPUTE_TEST_USES_INT64;
	}
}